

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,void **data,void *defaultValue,int defaultSize)

{
  char cVar1;
  char *src;
  void *pvVar2;
  int dsize;
  int local_24;
  
  src = Node::get(this->node,key);
  if (src == (char *)0x0) {
    if (defaultValue == (void *)0x0) {
      *data = (void *)0x0;
    }
    else {
      pvVar2 = malloc((long)defaultSize);
      *data = pvVar2;
      memcpy(pvVar2,defaultValue,(long)defaultSize);
    }
    cVar1 = '\0';
  }
  else {
    pvVar2 = decodeHex(src,&local_24);
    *data = pvVar2;
    cVar1 = '\x01';
  }
  return cVar1;
}

Assistant:

char Fl_Preferences::get( const char *key, void *&data, const void *defaultValue, int defaultSize ) {
  const char *v = node->get( key );
  if ( v ) {
    int dsize;
    data = decodeHex( v, dsize );
    return 1;
  }
  if ( defaultValue ) {
    data = (void*)malloc( defaultSize );
    memmove( data, defaultValue, defaultSize );
  }
  else
    data = 0;
  return 0;
}